

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O2

string * ApprovalTests::SystemUtils::getMachineName_abi_cxx11_(void)

{
  char *in_RDX;
  char *name_00;
  string *in_RDI;
  string name;
  string local_58;
  string local_38;
  
  safeGetEnvForNonWindows_abi_cxx11_(&local_58,(SystemUtils *)"COMPUTERNAME",in_RDX);
  if (local_58._M_string_length == 0) {
    safeGetEnvForNonWindows_abi_cxx11_(&local_38,(SystemUtils *)"HOSTNAME",name_00);
    ::std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    if (local_58._M_string_length == 0) {
      ::std::__cxx11::string::string((string *)in_RDI,"Unknown Computer",(allocator *)&local_38);
      goto LAB_0012e30e;
    }
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_58.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
  }
  in_RDI->_M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
LAB_0012e30e:
  ::std::__cxx11::string::~string((string *)&local_58);
  return in_RDI;
}

Assistant:

std::string SystemUtils::getMachineName()
    {
        auto name = safeGetEnv("COMPUTERNAME");
        if (!name.empty())
        {
            return name;
        }

        name = safeGetEnv("HOSTNAME");
        if (!name.empty())
        {
            return name;
        }

        return "Unknown Computer";
    }